

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront_workitems_soa.h
# Opt level: O0

MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial> * __thiscall
pbrt::SOA<pbrt::MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial>_>::operator[]
          (SOA<pbrt::MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial>_> *this,int i)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  Tuple2<pbrt::Point2,_float> TVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_EDX;
  SOA<pbrt::Point2<float>_> *in_RSI;
  MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial> *in_RDI;
  undefined1 auVar19 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined8 in_XMM1_Qb;
  Normal3f NVar20;
  Vector3f VVar21;
  SampledSpectrum SVar22;
  MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial> *r;
  MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial> *this_00;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  SOA<pbrt::MediumInterface> *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe78;
  int i_00;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe98;
  int i_01;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Interval local_6c;
  Interval IStack_64;
  Interval local_5c;
  undefined8 local_34;
  ulong uStack_2c;
  undefined8 uStack_24;
  undefined8 uStack_1c;
  undefined1 extraout_var [56];
  
  i_00 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  i_01 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  this_00 = in_RDI;
  MaterialEvalWorkItem<pbrt::CoatedDiffuseMaterial>::MaterialEvalWorkItem(in_RDI);
  in_RDI->material = *(CoatedDiffuseMaterial **)(in_RSI->x + (long)in_EDX * 2);
  SOA<pbrt::SampledWavelengths>::operator[]
            ((SOA<pbrt::SampledWavelengths> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),i_01);
  *(undefined8 *)(in_RDI->lambda).lambda.values = local_34;
  *(ulong *)((in_RDI->lambda).lambda.values + 2) = uStack_2c;
  *(undefined8 *)(in_RDI->lambda).pdf.values = uStack_24;
  *(undefined8 *)((in_RDI->lambda).pdf.values + 2) = uStack_1c;
  auVar19 = ZEXT856(uStack_2c);
  SVar22 = SOA<pbrt::SampledSpectrum>::operator[]
                     ((SOA<pbrt::SampledSpectrum> *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),i_00);
  auVar7._0_8_ = SVar22.values.values._0_8_;
  auVar7._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = SVar22.values.values._8_8_;
  uVar2 = vmovlpd_avx(auVar5);
  auVar19 = ZEXT856(uVar2);
  *(undefined8 *)(in_RDI->beta).values.values = uVar1;
  *(ulong *)((in_RDI->beta).values.values + 2) = uVar2;
  SVar22 = SOA<pbrt::SampledSpectrum>::operator[]
                     ((SOA<pbrt::SampledSpectrum> *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),i_00);
  auVar8._0_8_ = SVar22.values.values._0_8_;
  auVar8._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = SVar22.values.values._8_8_;
  uVar3 = vmovlpd_avx(auVar6);
  *(undefined8 *)(in_RDI->r_u).values.values = uVar1;
  *(undefined8 *)((in_RDI->r_u).values.values + 2) = uVar3;
  SOA<pbrt::Point3fi>::operator[]
            ((SOA<pbrt::Point3fi> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             i_00);
  (in_RDI->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = local_5c;
  auVar19 = ZEXT856((ulong)IStack_64);
  (in_RDI->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = local_6c;
  (in_RDI->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = IStack_64
  ;
  NVar20 = SOA<pbrt::Normal3<float>_>::operator[]
                     ((SOA<pbrt::Normal3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar9._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar9._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.z = NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  NVar20 = SOA<pbrt::Normal3<float>_>::operator[]
                     ((SOA<pbrt::Normal3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar10._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar10._0_16_);
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.z = NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar21 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar11._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar11._0_16_);
  (in_RDI->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  (in_RDI->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->dpdu).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar21 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar12._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar12._0_16_);
  (in_RDI->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  (in_RDI->dpdv).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->dpdv).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar21 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar13._0_16_);
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar21 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar14._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar14._0_16_);
  (in_RDI->dpdvs).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  (in_RDI->dpdvs).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->dpdvs).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  NVar20 = SOA<pbrt::Normal3<float>_>::operator[]
                     ((SOA<pbrt::Normal3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar15._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar15._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar15._0_16_);
  (in_RDI->dndus).super_Tuple3<pbrt::Normal3,_float>.z = NVar20.super_Tuple3<pbrt::Normal3,_float>.z
  ;
  (in_RDI->dndus).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->dndus).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  NVar20 = SOA<pbrt::Normal3<float>_>::operator[]
                     ((SOA<pbrt::Normal3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar16._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar16._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar16._0_16_);
  (in_RDI->dndvs).super_Tuple3<pbrt::Normal3,_float>.z = NVar20.super_Tuple3<pbrt::Normal3,_float>.z
  ;
  (in_RDI->dndvs).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->dndvs).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar21 = SOA<pbrt::Vector3<float>_>::operator[]
                     ((SOA<pbrt::Vector3<float>_> *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_RSI >> 0x20));
  auVar17._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar19;
  uVar1 = vmovlpd_avx(auVar17._0_16_);
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar18._0_8_ = SOA<pbrt::Point2<float>_>::operator[](in_RSI,(int)((ulong)this_00 >> 0x20));
  auVar18._8_56_ = extraout_var;
  TVar4 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar18._0_16_);
  (in_RDI->uv).super_Tuple2<pbrt::Point2,_float> = TVar4;
  in_RDI->depth = (int)in_RSI[0x14].y[in_EDX];
  in_RDI->faceIndex = *(int *)(*(long *)(in_RSI + 0x15) + (long)in_EDX * 4);
  in_RDI->time = in_RSI[0x15].x[in_EDX];
  in_RDI->anyNonSpecularBounces = (int)in_RSI[0x15].y[in_EDX];
  in_RDI->etaScale = *(Float *)(*(long *)(in_RSI + 0x16) + (long)in_EDX * 4);
  SOA<pbrt::MediumInterface>::operator[](in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  MediumInterface::operator=((MediumInterface *)this_00,(MediumInterface *)in_RDI);
  in_RDI->pixelIndex = (int)in_RSI[0x17].x[in_EDX];
  return this_00;
}

Assistant:

operator[](int i) const {
        DCHECK_LT(i, nAlloc);
        MaterialEvalWorkItem<ConcreteMaterial> r;
        r.material = this->material[i];
        r.lambda = this->lambda[i];
        r.beta = this->beta[i];
        r.r_u = this->r_u[i];
        r.pi = this->pi[i];
        r.n = this->n[i];
        r.ns = this->ns[i];
        r.dpdu = this->dpdu[i];
        r.dpdv = this->dpdv[i];
        r.dpdus = this->dpdus[i];
        r.dpdvs = this->dpdvs[i];
        r.dndus = this->dndus[i];
        r.dndvs = this->dndvs[i];
        r.wo = this->wo[i];
        r.uv = this->uv[i];
        r.depth = this->depth[i];
        r.faceIndex = this->faceIndex[i];
        r.time = this->time[i];
        r.anyNonSpecularBounces = this->anyNonSpecularBounces[i];
        r.etaScale = this->etaScale[i];
        r.mediumInterface = this->mediumInterface[i];
        r.pixelIndex = this->pixelIndex[i];
        return r;
    }